

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte endch;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  xml_encoding xVar4;
  undefined4 extraout_var;
  long lVar5;
  xml_node_struct *pxVar6;
  xml_node_struct *pxVar7;
  xml_attribute_struct *pxVar8;
  char_t *pcVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  xml_parse_status xVar13;
  xml_parse_status xVar14;
  char *__function;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  undefined4 uVar18;
  ushort *puVar19;
  ushort *puVar20;
  byte *pbVar21;
  xml_node_struct **ppxVar22;
  byte *pbVar23;
  byte *pbVar24;
  ushort uVar25;
  size_t sVar26;
  size_t __n;
  byte *pbVar27;
  byte *pbVar28;
  byte *pbVar29;
  void *pvVar30;
  ulong uVar31;
  char_t *buffer;
  size_t length;
  byte *local_f0;
  xml_parser local_e8;
  xml_node_struct *local_d0;
  byte *local_c8;
  byte *local_c0;
  undefined4 local_b4;
  byte *local_b0;
  byte *local_a8;
  xml_document_struct *local_a0;
  xml_node_struct *local_98;
  uint local_8c;
  gap local_88;
  xml_node_struct *local_70;
  code *local_68;
  undefined8 local_60;
  byte *local_58;
  xml_node_struct **local_50;
  code *local_48;
  code *local_40;
  byte *local_38;
  
  if (size != 0 && contents == (void *)0x0) {
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    return __return_storage_ptr__;
  }
  local_a0 = doc;
  xVar4 = get_buffer_encoding(encoding,contents,size);
  local_60 = CONCAT44(extraout_var,xVar4);
  pvVar30 = (void *)0x0;
  if (own) {
    pvVar30 = contents;
  }
  local_68 = (code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  local_c8 = (byte *)0x0;
  local_c0 = (byte *)0x0;
  local_98 = root;
  if (xVar4 == encoding_utf8) {
LAB_00131736:
    bVar2 = get_mutable_buffer((char_t **)&local_c8,(size_t *)&local_c0,contents,size,is_mutable);
    goto LAB_00131754;
  }
  if ((xVar4 & ~encoding_utf8) == encoding_utf16_le) {
    uVar31 = size >> 1;
    lVar5 = 0;
    if (xVar4 == encoding_utf16_le) {
      uVar15 = uVar31;
      puVar19 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar10 = *puVar19;
          if (uVar10 < 0xd800) {
            lVar16 = 3 - (ulong)(uVar10 < 0x800);
            if (uVar10 < 0x80) {
              lVar16 = 1;
            }
            lVar5 = lVar5 + lVar16;
LAB_0013192e:
            puVar20 = puVar19 + 1;
            lVar16 = -1;
          }
          else {
            if ((~uVar10 & 0xe000) == 0) {
              lVar5 = lVar5 + 3;
              goto LAB_0013192e;
            }
            puVar20 = puVar19 + 1;
            lVar16 = -1;
            if (((uVar15 != 1) && ((uVar10 & 0xfc00) == 0xd800)) && ((*puVar20 & 0xfc00) == 0xdc00))
            {
              lVar5 = lVar5 + 4;
              puVar20 = puVar19 + 2;
              lVar16 = -2;
            }
          }
          uVar15 = uVar15 + lVar16;
          puVar19 = puVar20;
        } while (uVar15 != 0);
      }
      pbVar27 = (byte *)(lVar5 + 1);
      pbVar23 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(pbVar27);
      bVar2 = pbVar23 != (byte *)0x0;
      if (bVar2) {
        pbVar29 = pbVar23;
        puVar19 = (ushort *)contents;
        if (1 < size) {
          do {
            uVar10 = *puVar19;
            uVar17 = (uint)uVar10;
            if ((uVar10 < 0xd800) || ((~uVar10 & 0xe000) == 0)) {
              pbVar29 = utf8_writer::low(pbVar29,uVar17);
              puVar20 = puVar19 + 1;
              lVar16 = -1;
            }
            else {
              puVar20 = puVar19 + 1;
              lVar16 = -1;
              if ((uVar31 != 1) && ((uVar17 & 0xfc00) == 0xd800)) {
                uVar10 = *puVar20;
                if ((uVar10 & 0xfc00) == 0xdc00) {
                  uVar11 = (uVar17 << 10 & 0xffc00) + 0x10000;
                  *pbVar29 = (byte)(uVar11 >> 0x12) | 0xf0;
                  pbVar29[1] = (byte)(uVar11 >> 0xc) & 0x3f | 0x80;
                  pbVar29[2] = (byte)((uVar10 & 0x3c0 | uVar17 << 10) >> 6) & 0x3f | 0x80;
                  pbVar29[3] = (byte)uVar10 & 0x3f | 0x80;
                  pbVar29 = pbVar29 + 4;
                  puVar20 = puVar19 + 2;
                  lVar16 = -2;
                }
              }
            }
            uVar31 = uVar31 + lVar16;
            puVar19 = puVar20;
          } while (uVar31 != 0);
        }
        if (pbVar29 != pbVar23 + lVar5) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
LAB_00132f0a:
          __assert_fail("oend == obegin + length",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                        ,0x89f,__function);
        }
LAB_0013186e:
        *pbVar29 = 0;
        local_c8 = pbVar23;
        local_c0 = pbVar27;
        goto LAB_00131e5d;
      }
    }
    else {
      uVar15 = uVar31;
      puVar19 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar10 = *puVar19 << 8;
          uVar25 = uVar10 | *puVar19 >> 8;
          if (uVar25 < 0xd800) {
            lVar16 = 3 - (ulong)(uVar25 < 0x800);
            if (uVar25 < 0x80) {
              lVar16 = 1;
            }
            lVar5 = lVar5 + lVar16;
LAB_001319f0:
            puVar20 = puVar19 + 1;
            lVar16 = -1;
          }
          else {
            if ((~uVar25 & 0xe000) == 0) {
              lVar5 = lVar5 + 3;
              goto LAB_001319f0;
            }
            puVar20 = puVar19 + 1;
            lVar16 = -1;
            if (((uVar15 != 1) && ((uVar10 & 0xfc00) == 0xd800)) && ((*puVar20 & 0xfc) == 0xdc)) {
              lVar5 = lVar5 + 4;
              puVar20 = puVar19 + 2;
              lVar16 = -2;
            }
          }
          uVar15 = uVar15 + lVar16;
          puVar19 = puVar20;
        } while (uVar15 != 0);
      }
      pbVar27 = (byte *)(lVar5 + 1);
      pbVar23 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(pbVar27);
      bVar2 = pbVar23 != (byte *)0x0;
      if (bVar2) {
        pbVar29 = pbVar23;
        puVar19 = (ushort *)contents;
        if (1 < size) {
          do {
            uVar10 = *puVar19 << 8 | *puVar19 >> 8;
            uVar17 = (uint)uVar10;
            if ((uVar10 < 0xd800) || ((~uVar10 & 0xe000) == 0)) {
              pbVar29 = utf8_writer::low(pbVar29,uVar17);
              puVar20 = puVar19 + 1;
              lVar16 = -1;
            }
            else {
              puVar20 = puVar19 + 1;
              lVar16 = -1;
              if ((uVar31 != 1) && ((uVar17 & 0xfc00) == 0xd800)) {
                uVar10 = *puVar20;
                uVar11 = (uint)(ushort)(uVar10 << 8 | uVar10 >> 8);
                if ((uVar11 & 0xfc00) == 0xdc00) {
                  uVar12 = (uVar17 << 10 & 0xffc00) + 0x10000;
                  *pbVar29 = (byte)(uVar12 >> 0x12) | 0xf0;
                  pbVar29[1] = (byte)(uVar12 >> 0xc) & 0x3f | 0x80;
                  pbVar29[2] = (byte)((uVar11 & 0x3c0 | uVar17 << 10) >> 6) & 0x3f | 0x80;
                  pbVar29[3] = (byte)(uVar10 >> 8) & 0x3f | 0x80;
                  pbVar29 = pbVar29 + 4;
                  puVar20 = puVar19 + 2;
                  lVar16 = -2;
                }
              }
            }
            uVar31 = uVar31 + lVar16;
            puVar19 = puVar20;
          } while (uVar31 != 0);
        }
        if (pbVar29 != pbVar23 + lVar5) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_00132f0a;
        }
        goto LAB_0013186e;
      }
    }
LAB_00131754:
    if (bVar2 == false) {
      __return_storage_ptr__->offset = 0;
      __return_storage_ptr__->encoding = encoding_auto;
      __return_storage_ptr__->status = status_out_of_memory;
      goto LAB_00132d8a;
    }
  }
  else {
    if (xVar4 - encoding_utf32_le < 2) {
      uVar31 = size >> 2;
      if (xVar4 == encoding_utf32_le) {
        if (size < 4) {
          lVar5 = 0;
        }
        else {
          uVar15 = 0;
          lVar5 = 0;
          do {
            uVar17 = *(uint *)((long)contents + uVar15 * 4);
            lVar16 = 4;
            if ((uVar17 < 0x10000) && (lVar16 = 1, 0x7f < uVar17)) {
              lVar16 = 3 - (ulong)(uVar17 < 0x800);
            }
            lVar5 = lVar5 + lVar16;
            uVar15 = uVar15 + 1;
          } while (uVar31 != uVar15);
        }
        pbVar27 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)();
        bVar2 = pbVar27 != (byte *)0x0;
        if (bVar2) {
          pbVar23 = pbVar27;
          if (3 < size) {
            uVar15 = 0;
            do {
              uVar17 = *(uint *)((long)contents + uVar15 * 4);
              if (uVar17 < 0x10000) {
                pbVar23 = utf8_writer::low(pbVar23,uVar17);
              }
              else {
                *pbVar23 = (byte)(uVar17 >> 0x12) | 0xf0;
                pbVar23[1] = (byte)(uVar17 >> 0xc) & 0x3f | 0x80;
                pbVar23[2] = (byte)(uVar17 >> 6) & 0x3f | 0x80;
                pbVar23[3] = (byte)uVar17 & 0x3f | 0x80;
                pbVar23 = pbVar23 + 4;
              }
              uVar15 = uVar15 + 1;
            } while (uVar31 != uVar15);
          }
          if (pbVar23 != pbVar27 + lVar5) {
            __function = 
            "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
            ;
            goto LAB_00132f0a;
          }
LAB_00131dcd:
          local_f0 = (byte *)(lVar5 + 1);
          *pbVar23 = 0;
          local_c0 = local_f0;
          local_c8 = pbVar27;
          goto LAB_00131e5d;
        }
      }
      else {
        if (size < 4) {
          lVar5 = 0;
        }
        else {
          uVar15 = 0;
          lVar5 = 0;
          do {
            uVar17 = *(uint *)((long)contents + uVar15 * 4);
            uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                     uVar17 << 0x18;
            lVar16 = 4;
            if ((uVar17 < 0x10000) && (lVar16 = 1, 0x7f < uVar17)) {
              lVar16 = 3 - (ulong)(uVar17 < 0x800);
            }
            lVar5 = lVar5 + lVar16;
            uVar15 = uVar15 + 1;
          } while (uVar31 != uVar15);
        }
        pbVar27 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)();
        bVar2 = pbVar27 != (byte *)0x0;
        if (bVar2) {
          pbVar23 = pbVar27;
          if (3 < size) {
            uVar15 = 0;
            do {
              uVar17 = *(uint *)((long)contents + uVar15 * 4);
              uVar11 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                       uVar17 << 0x18;
              if (uVar11 < 0x10000) {
                pbVar23 = utf8_writer::low(pbVar23,uVar11);
              }
              else {
                *pbVar23 = (byte)(uVar11 >> 0x12) | 0xf0;
                pbVar23[1] = (byte)(uVar11 >> 0xc) & 0x3f | 0x80;
                pbVar23[2] = (byte)(uVar11 >> 6) & 0x3f | 0x80;
                pbVar23[3] = (byte)(uVar17 >> 0x18) & 0x3f | 0x80;
                pbVar23 = pbVar23 + 4;
              }
              uVar15 = uVar15 + 1;
            } while (uVar31 != uVar15);
          }
          if (pbVar23 != pbVar27 + lVar5) {
            __function = 
            "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
            ;
            goto LAB_00132f0a;
          }
          goto LAB_00131dcd;
        }
      }
      goto LAB_00131754;
    }
    if (xVar4 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0x8f4,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                   );
    }
    sVar26 = 0;
    __n = sVar26;
    if (size != 0) {
      do {
        __n = sVar26;
        if (*(char *)((long)contents + sVar26) < '\0') break;
        sVar26 = sVar26 + 1;
        __n = size;
      } while (size != sVar26);
    }
    if (size <= __n) goto LAB_00131736;
    if (size == __n) {
      lVar5 = 0;
    }
    else {
      lVar5 = 0;
      uVar31 = __n;
      do {
        lVar5 = lVar5 + (ulong)(*(byte *)((long)contents + uVar31) >> 7) + 1;
        uVar31 = uVar31 + 1;
      } while (size != uVar31);
    }
    local_a8 = (byte *)(__n + lVar5 + 1);
    pbVar27 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                                allocate)();
    bVar2 = pbVar27 != (byte *)0x0;
    if (pbVar27 == (byte *)0x0) goto LAB_00131754;
    lVar5 = lVar5 + __n;
    memcpy(pbVar27,contents,__n);
    pbVar23 = pbVar27 + __n;
    for (; size != __n; __n = __n + 1) {
      pbVar23 = utf8_writer::low(pbVar23,(uint)*(byte *)((long)contents + __n));
    }
    if (pbVar23 != pbVar27 + lVar5) {
      __assert_fail("oend == obegin + length",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0x8cd,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                   );
    }
    *pbVar23 = 0;
    local_c8 = pbVar27;
    local_c0 = local_a8;
  }
LAB_00131e5d:
  pbVar27 = local_c8;
  if (own) {
    if (contents != (void *)0x0 && local_c8 != (byte *)contents) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
    bVar2 = pbVar27 == (byte *)contents && !own;
  }
  else {
    bVar2 = local_c8 == (byte *)contents;
  }
  if (!bVar2) {
    *out_buffer = (char_t *)local_c8;
  }
  local_a0->buffer = (char_t *)local_c8;
  xVar4 = (xml_encoding)local_60;
  if (local_c0 != (byte *)0x0) {
    if (local_98->first_child == (xml_node_struct *)0x0) {
      local_70 = (xml_node_struct *)0x0;
    }
    else {
      local_70 = local_98->first_child->prev_sibling_c;
    }
    local_e8.alloc = &local_a0->super_xml_allocator;
    if (local_a0 == (xml_document_struct *)0x0) {
      local_e8.alloc = (xml_allocator *)0x0;
    }
    local_e8.error_offset = (char_t *)0x0;
    local_e8.error_status = status_ok;
    endch = (local_c8 + -1)[(long)local_c0];
    (local_c8 + -1)[(long)local_c0] = 0;
    pbVar27 = local_c8;
    if ((*local_c8 == 0xef) && (local_c8[1] == 0xbb)) {
      pbVar27 = local_c8 + (ulong)(local_c8[2] == 0xbf) * 3;
    }
    local_a8 = local_c8;
    local_50 = &local_98->first_child;
    local_38 = local_c0;
    local_b0 = local_c0 + -1;
    local_40 = *(code **)((long)&PTR_parse_simple_00248058 + (ulong)(options >> 1 & 0x78));
    local_48 = (code *)(&PTR_parse_002480d8)[options >> 9 & 4 | options >> 4 & 3];
    local_a0 = (xml_document_struct *)
               CONCAT71(local_a0._1_7_,(options >> 0xb & 1) == 0 && (options & 0x408) != 0);
    local_8c = options & 0x22;
    pxVar7 = local_98;
LAB_00132000:
    while( true ) {
      pbVar29 = pbVar27;
      pbVar23 = pbVar29;
      if (*pbVar29 == 0) goto LAB_00132ce3;
      if (*pbVar29 == 0x3c) {
        pbVar23 = pbVar29 + 1;
        goto LAB_00132112;
      }
      lVar5 = 0;
      do {
        lVar16 = lVar5;
        bVar3 = pbVar29[lVar16];
        lVar5 = lVar16 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0);
      if ((bVar3 != 0x3c) && (bVar3 != 0)) break;
      if (lVar5 == 1) {
        __assert_fail("mark != s",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0xd74,
                      "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                     );
      }
      pbVar27 = pbVar29 + lVar16;
      if (((char)local_a0 != '\0') &&
         (((options >> 10 & 1) == 0 ||
          (((bVar3 == 0x3c && (pbVar29[lVar5] == 0x2f)) &&
           (pxVar7->first_child == (xml_node_struct *)0x0)))))) break;
    }
    pbVar23 = pbVar29 + lVar16;
    if ((options >> 0xb & 1) == 0) {
      pbVar23 = pbVar29;
    }
    if (((options >> 0xc & 1) != 0) || (pxVar7->parent != (xml_node_struct *)0x0)) {
      if ((((options >> 0xd & 1) == 0) ||
          ((pxVar7->parent == (xml_node_struct *)0x0 ||
           (pxVar7->first_child != (xml_node_struct *)0x0)))) || (pxVar7->value != (char_t *)0x0)) {
        pxVar7 = append_new_node(pxVar7,local_e8.alloc,node_pcdata);
        if (pxVar7 != (xml_node_struct *)0x0) {
          pxVar7->value = (char_t *)pbVar23;
          pxVar7 = pxVar7->parent;
          goto LAB_001320ef;
        }
LAB_00132e16:
        local_e8.error_offset = (char_t *)pbVar23;
        local_e8.error_status = status_out_of_memory;
      }
      else {
        pxVar7->value = (char_t *)pbVar23;
LAB_001320ef:
        pbVar23 = (byte *)(*local_48)(pbVar23);
        if (*pbVar23 != 0) goto LAB_00132112;
LAB_00132ce3:
        if (pxVar7 != local_98) {
          local_e8.error_status = status_end_element_mismatch;
          local_e8.error_offset = (char_t *)pbVar23;
        }
      }
      goto LAB_00132cf8;
    }
    do {
      bVar3 = *pbVar23;
      if (bVar3 == 0) goto LAB_00132ce3;
      pbVar23 = pbVar23 + 1;
    } while (bVar3 != 0x3c);
LAB_00132112:
    bVar3 = *pbVar23;
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar3]) {
      if (bVar3 == 0x21) {
        bVar3 = pbVar23[1];
        if (bVar3 == 0x5b) {
          if (pbVar23[2] == 0x43) {
            if (pbVar23[3] == 0x44) {
              if (pbVar23[4] == 0x41) {
                if (pbVar23[5] == 0x54) {
                  if (pbVar23[6] == 0x41) {
                    if (pbVar23[7] == 0x5b) {
                      pbVar23 = pbVar23 + 8;
                      if ((options & 4) == 0) {
                        do {
                          if (*pbVar23 == 0x5d) {
                            if (pbVar23[1] == 0x5d) {
                              if ((pbVar23[2] == 0x3e) || (endch == 0x3e && pbVar23[2] == 0))
                              goto LAB_00132c76;
                            }
                          }
                          else if (*pbVar23 == 0) goto LAB_00132c91;
                          pbVar23 = pbVar23 + 1;
                        } while( true );
                      }
                      pxVar6 = append_new_node(pxVar7,local_e8.alloc,node_cdata);
                      if (pxVar6 == (xml_node_struct *)0x0) {
                        local_e8.error_status = status_out_of_memory;
                        local_e8.error_offset = (char_t *)pbVar23;
                      }
                      else {
                        pxVar6->value = (char_t *)pbVar23;
                        if ((options & 0x20) == 0) {
LAB_00132b96:
                          if (*pbVar23 == 0x5d) {
                            if (pbVar23[1] != 0x5d) goto LAB_00132bd1;
                            if ((pbVar23[2] != 0x3e) && (endch != 0x3e || pbVar23[2] != 0))
                            goto LAB_00132bd1;
                            *pbVar23 = 0;
LAB_00132c76:
                            pbVar23 = pbVar23 + 1;
                            goto LAB_00132c79;
                          }
                          if (*pbVar23 != 0) goto LAB_00132bd1;
                          goto LAB_00132c91;
                        }
                        pbVar23 = (byte *)strconv_cdata((char_t *)pbVar23,endch);
                        if (pbVar23 != (byte *)0x0) {
LAB_00132c79:
                          pbVar27 = pbVar23 + (ulong)(pbVar23[1] == 0x3e) + 1;
                          goto LAB_00132b3d;
                        }
                        pbVar23 = (byte *)pxVar6->value;
LAB_00132c91:
                        local_e8.error_offset = (char_t *)pbVar23;
                        local_e8.error_status = status_bad_cdata;
                      }
                      pbVar27 = (byte *)0x0;
                      goto LAB_00132b3d;
                    }
                    local_e8.error_offset = (char_t *)(pbVar23 + 7);
                  }
                  else {
                    local_e8.error_offset = (char_t *)(pbVar23 + 6);
                  }
                }
                else {
                  local_e8.error_offset = (char_t *)(pbVar23 + 5);
                }
              }
              else {
                local_e8.error_offset = (char_t *)(pbVar23 + 4);
              }
            }
            else {
              local_e8.error_offset = (char_t *)(pbVar23 + 3);
            }
          }
          else {
            local_e8.error_offset = (char_t *)(pbVar23 + 2);
          }
LAB_00132b32:
          local_e8.error_status = status_bad_cdata;
          goto LAB_00132b3a;
        }
        if (bVar3 == 0x44) {
          if ((((pbVar23[2] == 0x4f) && (pbVar23[3] == 0x43)) && (pbVar23[4] == 0x54)) &&
             ((pbVar23[5] == 0x59 && (pbVar23[6] == 0x50)))) {
            if ((pbVar23[7] != 0x45) && (endch != 0x45 || pbVar23[7] != 0)) goto LAB_0013251c;
            if (pxVar7->parent == (xml_node_struct *)0x0) {
              pbVar27 = (byte *)xml_parser::parse_doctype_group
                                          (&local_e8,(char_t *)(pbVar23 + -1),endch);
              if (pbVar27 == (byte *)0x0) goto LAB_001328c1;
              bVar3 = *pbVar27;
              if ((bVar3 != 0x3e) && (endch != 0x3e || bVar3 != 0)) {
                __assert_fail("(*s == 0 && endch == \'>\') || *s == \'>\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                              ,0xc4a,
                              "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_exclamation(char_t *, xml_node_struct *, unsigned int, char_t)"
                             );
              }
              if (bVar3 != 0) {
                *pbVar27 = 0;
                pbVar27 = pbVar27 + 1;
              }
              if ((options >> 9 & 1) != 0) {
                pbVar23 = pbVar23 + 7;
                do {
                  pbVar29 = pbVar23 + 1;
                  pbVar23 = pbVar23 + 1;
                } while (((anonymous_namespace)::chartype_table[*pbVar29] & 8) != 0);
                pxVar6 = append_new_node(pxVar7,local_e8.alloc,node_doctype);
                if (pxVar6 == (xml_node_struct *)0x0) goto LAB_001328b9;
                pxVar6->value = (char_t *)pbVar23;
              }
              goto LAB_00132b3d;
            }
            local_e8.error_status = status_bad_doctype;
            local_e8.error_offset = (char_t *)(pbVar23 + -1);
          }
          else {
LAB_0013251c:
            local_e8.error_offset = (char_t *)(pbVar23 + 1);
            if ((endch == 0x2d) && (pbVar27 = (byte *)local_e8.error_offset, bVar3 == 0))
            goto LAB_00132678;
            if ((endch == 0x5b) && (bVar3 == 0)) goto LAB_00132b32;
            local_e8.error_status = status_unrecognized_tag;
          }
          goto LAB_00132b3a;
        }
        if (bVar3 != 0x2d) goto LAB_0013251c;
        if (pbVar23[2] != 0x2d) {
          pbVar27 = pbVar23 + 2;
          goto LAB_00132678;
        }
        pbVar27 = pbVar23 + 3;
        pxVar6 = pxVar7;
        if ((options & 2) == 0) {
LAB_001322d9:
          if (local_8c != 0x22) {
            do {
              if (*pbVar27 == 0x2d) {
                if (pbVar27[1] == 0x2d) {
                  if ((pbVar27[2] == 0x3e) || (endch == 0x3e && pbVar27[2] == 0)) {
                    if ((options & 2) != 0) {
                      *pbVar27 = 0;
                    }
                    pbVar27 = pbVar27 + (ulong)(pbVar27[2] == 0x3e) + 2;
                    goto LAB_00132b3d;
                  }
                }
              }
              else if (*pbVar27 == 0) goto LAB_00132678;
              pbVar27 = pbVar27 + 1;
            } while( true );
          }
          local_88.end = (char_t *)0x0;
          local_88.size = 0;
          local_d0 = pxVar7;
LAB_001322f4:
          do {
            pbVar23 = pbVar27;
            if (((anonymous_namespace)::chartype_table[*pbVar27] & 0x20) == 0) {
              if (((anonymous_namespace)::chartype_table[pbVar27[1]] & 0x20) != 0) {
                pbVar23 = pbVar27 + 1;
                goto LAB_001323ee;
              }
              if (((anonymous_namespace)::chartype_table[pbVar27[2]] & 0x20) != 0) {
                pbVar23 = pbVar27 + 2;
                goto LAB_001323ee;
              }
              bVar2 = ((anonymous_namespace)::chartype_table[pbVar27[3]] & 0x20) == 0;
              if (bVar2) {
                pbVar23 = pbVar27 + 4;
              }
              else {
                pbVar23 = pbVar27 + 3;
              }
            }
            else {
LAB_001323ee:
              bVar2 = false;
            }
            pbVar27 = pbVar23;
          } while (bVar2);
          bVar3 = *pbVar23;
          if (bVar3 == 0xd) {
            pbVar27 = pbVar23 + 1;
            *pbVar23 = 10;
            if (pbVar23[1] == 10) {
              if ((byte *)local_88.end != (byte *)0x0) {
                if (pbVar27 < local_88.end) {
                  __assert_fail("s >= end",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                                ,0x985,
                                "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)"
                               );
                }
                memmove(local_88.end + -local_88.size,local_88.end,
                        (long)pbVar27 - (long)local_88.end);
              }
              pbVar27 = pbVar23 + 2;
              local_88.size = local_88.size + 1;
              local_88.end = (char_t *)pbVar27;
            }
            goto LAB_001322f4;
          }
          if (bVar3 == 0x2d) {
            if ((pbVar23[1] == 0x2d) && ((pbVar23[2] == 0x3e || (endch == 0x3e && pbVar23[2] == 0)))
               ) {
              pcVar9 = gap::flush(&local_88,(char_t *)pbVar23);
              *pcVar9 = '\0';
              pbVar27 = pbVar23 + (ulong)(pbVar23[2] == 0x3e) + 2;
              goto LAB_001327a2;
            }
          }
          else if (bVar3 == 0) goto LAB_0013279f;
          pbVar27 = pbVar23 + 1;
          goto LAB_001322f4;
        }
        pxVar6 = append_new_node(pxVar7,local_e8.alloc,node_comment);
        if (pxVar6 != (xml_node_struct *)0x0) {
          pxVar6->value = (char_t *)pbVar27;
          goto LAB_001322d9;
        }
LAB_001328b9:
        local_e8.error_offset = (char_t *)pbVar27;
        local_e8.error_status = status_out_of_memory;
LAB_001328c1:
        pbVar27 = (byte *)0x0;
        goto LAB_00132b3d;
      }
      if (bVar3 == 0x3f) {
        pbVar27 = pbVar23 + 1;
        if (-1 < (char)(anonymous_namespace)::chartype_table[pbVar23[1]]) goto LAB_00132262;
        lVar5 = 4;
        pbVar29 = pbVar23 + 3;
        pbVar24 = pbVar27;
        do {
          pbVar28 = pbVar24;
          pbVar21 = pbVar29;
          pbVar24 = pbVar28 + 1;
          lVar5 = lVar5 + -1;
          pbVar29 = pbVar21 + 1;
        } while (((anonymous_namespace)::chartype_table[*pbVar28] & 0x40) != 0);
        local_d0 = pxVar7;
        if (*pbVar28 == 0) {
LAB_00132647:
          local_e8.error_offset = (char_t *)pbVar28;
          local_e8.error_status = status_bad_pi;
LAB_00132657:
          pbVar27 = (byte *)0x0;
          pxVar7 = local_d0;
        }
        else {
          if (((pbVar23[1] & 0xdf) == 0x58) && ((pbVar23[2] & 0xdf) == 0x4d)) {
            uVar18 = (undefined4)
                     CONCAT71((int7)((ulong)pbVar29 >> 8),lVar5 == 0 && (pbVar23[3] & 0xdf) == 0x4c)
            ;
          }
          else {
            uVar18 = 0;
          }
          uVar17 = 1;
          if ((char)uVar18 != '\0') {
            uVar17 = 0x100;
          }
          if ((options & uVar17) == 0) {
            do {
              if (*pbVar28 == 0x3f) {
                bVar3 = pbVar28[1];
                if ((bVar3 == 0x3e) || (endch == 0x3e && bVar3 == 0)) {
                  pbVar27 = pbVar28 + (ulong)(bVar3 == 0x3e) + 1;
                  goto LAB_00132917;
                }
              }
              else {
                pbVar27 = pbVar28;
                if (*pbVar28 == 0) goto LAB_00132262;
              }
              pbVar28 = pbVar28 + 1;
            } while( true );
          }
          if ((char)uVar18 == '\0') {
            local_b4 = uVar18;
            pxVar7 = append_new_node(pxVar7,local_e8.alloc,node_pi);
            if (pxVar7 == (xml_node_struct *)0x0) goto LAB_001328a2;
LAB_00132725:
            pxVar7->name = (char_t *)pbVar27;
            bVar3 = *pbVar28;
            *pbVar28 = 0;
            if ((ulong)bVar3 != 0x3f) {
              pbVar27 = pbVar28;
              pbVar28 = pbVar24;
              if (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0) {
                do {
                  pbVar29 = pbVar21;
                  pbVar23 = pbVar27 + 1;
                  pbVar27 = pbVar27 + 1;
                  pbVar21 = pbVar29 + 1;
                } while (((anonymous_namespace)::chartype_table[*pbVar23] & 8) != 0);
                do {
                  if (pbVar29[-1] == 0x3f) {
                    if ((*pbVar29 == 0x3e) || (endch == 0x3e && *pbVar29 == 0)) {
                      if ((char)local_b4 == '\0') {
                        pxVar7->value = (char_t *)pbVar27;
                        pxVar7 = pxVar7->parent;
                        pbVar29[-1] = 0;
                        pbVar27 = pbVar29 + (*pbVar29 == 0x3e);
                      }
                      else {
                        pbVar29[-1] = 0x2f;
                      }
                      goto LAB_00132917;
                    }
                  }
                  else if (pbVar29[-1] == 0) goto LAB_00132afe;
                  pbVar29 = pbVar29 + 1;
                } while( true );
              }
              goto LAB_00132647;
            }
            bVar3 = *pbVar24;
            if ((bVar3 == 0x3e) || (endch == 0x3e && bVar3 == 0)) {
              pbVar27 = pbVar24 + (bVar3 == 0x3e);
              pxVar7 = pxVar7->parent;
              goto LAB_00132917;
            }
            local_e8.error_status = status_bad_pi;
            local_e8.error_offset = (char_t *)pbVar24;
            goto LAB_00132657;
          }
          if (pxVar7->parent == (xml_node_struct *)0x0) {
            local_b4 = uVar18;
            local_58 = pbVar27;
            pxVar7 = append_new_node(pxVar7,local_e8.alloc,node_declaration);
            pbVar27 = local_58;
            if (pxVar7 != (xml_node_struct *)0x0) goto LAB_00132725;
LAB_001328a2:
            local_e8.error_status = status_out_of_memory;
            local_e8.error_offset = (char_t *)pbVar28;
            goto LAB_00132657;
          }
          local_e8.error_status = status_bad_pi;
          pbVar27 = (byte *)0x0;
          local_e8.error_offset = (char_t *)pbVar28;
        }
        goto LAB_00132917;
      }
      if (bVar3 != 0x2f) {
        local_e8.error_status = (endch == 0x3f && bVar3 == 0) + status_unrecognized_tag;
        local_e8.error_offset = (char_t *)pbVar23;
        goto LAB_00132cf8;
      }
      pbVar23 = pbVar23 + 1;
      pbVar29 = (byte *)pxVar7->name;
      xVar14 = status_end_element_mismatch;
      xVar13 = status_end_element_mismatch;
      pbVar24 = pbVar23;
      pbVar27 = pbVar23;
      if (pbVar29 != (byte *)0x0) {
LAB_00132150:
        bVar3 = *pbVar27;
        xVar14 = xVar13;
        if (((anonymous_namespace)::chartype_table[bVar3] & 0x40) != 0) goto code_r0x0013215d;
        if (*pbVar29 == 0) {
          pxVar7 = pxVar7->parent;
          do {
            pbVar24 = pbVar27;
            bVar3 = *pbVar24;
            pbVar27 = pbVar24 + 1;
          } while (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0);
          pbVar23 = pbVar24;
          if (bVar3 != 0) {
            if (bVar3 == 0x3e) {
              bVar2 = true;
              goto LAB_001327ec;
            }
            xVar14 = status_bad_end_element;
            goto LAB_001327de;
          }
          bVar2 = true;
          pbVar27 = pbVar24;
          xVar14 = status_bad_end_element;
          if (endch != 0x3e) goto LAB_001327de;
          goto LAB_001327ec;
        }
        pbVar24 = pbVar27;
        if (((bVar3 == 0) && (*pbVar29 == endch)) && (pbVar29[1] == 0)) {
          pbVar23 = pbVar27;
          xVar14 = status_bad_end_element;
        }
      }
LAB_001327de:
      bVar2 = false;
      pbVar27 = pbVar24;
      local_e8.error_offset = (char_t *)pbVar23;
      local_e8.error_status = xVar14;
LAB_001327ec:
      if (!bVar2) goto LAB_00132cf8;
      goto LAB_00132000;
    }
    pxVar7 = append_new_node(pxVar7,local_e8.alloc,node_element);
    if (pxVar7 == (xml_node_struct *)0x0) goto LAB_00132e16;
    pxVar7->name = (char_t *)pbVar23;
    do {
      if (((anonymous_namespace)::chartype_table[*pbVar23] & 0x40) == 0) {
LAB_001321e3:
        bVar3 = 0;
      }
      else {
        if (((anonymous_namespace)::chartype_table[pbVar23[1]] & 0x40) == 0) {
          pbVar23 = pbVar23 + 1;
          goto LAB_001321e3;
        }
        if (((anonymous_namespace)::chartype_table[pbVar23[2]] & 0x40) == 0) {
          pbVar23 = pbVar23 + 2;
          goto LAB_001321e3;
        }
        bVar3 = ((anonymous_namespace)::chartype_table[pbVar23[3]] & 0x40) >> 6;
        if (bVar3 == 0) {
          pbVar23 = pbVar23 + 3;
        }
        else {
          pbVar23 = pbVar23 + 4;
        }
      }
    } while (bVar3 != 0);
    bVar3 = *pbVar23;
    uVar31 = (ulong)bVar3;
    pbVar27 = pbVar23 + 1;
    *pbVar23 = 0;
    if (uVar31 == 0x3e) goto LAB_00132000;
    if (((anonymous_namespace)::chartype_table[uVar31] & 8) != 0) goto LAB_00132937;
    if (uVar31 == 0) {
      pbVar27 = pbVar23;
      if (endch == 0x3e) goto LAB_00132000;
    }
    else {
      pbVar23 = pbVar27;
      if (bVar3 != 0x2f) goto LAB_00132e58;
      bVar3 = *pbVar27;
      if ((bVar3 == 0x3e) || (endch == 0x3e && bVar3 == 0)) {
        pxVar7 = pxVar7->parent;
        pbVar27 = pbVar27 + (bVar3 == 0x3e);
        goto LAB_00132000;
      }
    }
LAB_00132e58:
    local_e8.error_offset = (char_t *)pbVar23;
    local_e8.error_status = status_bad_start_element;
    goto LAB_00132cf8;
  }
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->encoding = encoding_auto;
  __return_storage_ptr__->status = ~options >> 8 & status_no_document_element;
  goto LAB_00132d83;
LAB_00132bd1:
  pbVar23 = pbVar23 + 1;
  goto LAB_00132b96;
LAB_0013279f:
  pbVar27 = (byte *)0x0;
LAB_001327a2:
  pxVar7 = local_d0;
  if (pbVar27 == (byte *)0x0) {
    pbVar27 = (byte *)pxVar6->value;
LAB_00132678:
    local_e8.error_offset = (char_t *)pbVar27;
    local_e8.error_status = status_bad_comment;
LAB_00132b3a:
    pbVar27 = (byte *)0x0;
  }
LAB_00132b3d:
  if (pbVar27 == (byte *)0x0) goto LAB_00132cf8;
  goto LAB_00132000;
LAB_00132afe:
  pxVar7 = local_d0;
  pbVar27 = pbVar29 + -1;
LAB_00132262:
  local_e8.error_offset = (char_t *)pbVar27;
  local_e8.error_status = status_bad_pi;
  pbVar27 = (byte *)0x0;
LAB_00132917:
  if (pbVar27 == (byte *)0x0) goto LAB_00132cf8;
  if (pxVar7 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xd60,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  if ((pxVar7->header & 0xf) != 7) goto LAB_00132000;
LAB_00132937:
  while( true ) {
    do {
      pbVar23 = pbVar27;
      bVar3 = *pbVar23;
      pbVar27 = pbVar23 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar3]) break;
    pxVar8 = append_new_attribute(pxVar7,local_e8.alloc);
    if (pxVar8 == (xml_attribute_struct *)0x0) {
      pbVar27 = pbVar23;
      xVar14 = status_out_of_memory;
LAB_00132a2b:
      bVar2 = false;
      local_e8.error_offset = (char_t *)pbVar27;
      local_e8.error_status = xVar14;
    }
    else {
      pxVar8->name = (char_t *)pbVar23;
      do {
        if (((anonymous_namespace)::chartype_table[*pbVar23] & 0x40) == 0) {
LAB_001329b8:
          bVar3 = 0;
        }
        else {
          if (((anonymous_namespace)::chartype_table[pbVar23[1]] & 0x40) == 0) {
            pbVar23 = pbVar23 + 1;
            goto LAB_001329b8;
          }
          if (((anonymous_namespace)::chartype_table[pbVar23[2]] & 0x40) == 0) {
            pbVar23 = pbVar23 + 2;
            goto LAB_001329b8;
          }
          bVar3 = ((anonymous_namespace)::chartype_table[pbVar23[3]] & 0x40) >> 6;
          if (bVar3 == 0) {
            pbVar23 = pbVar23 + 3;
          }
          else {
            pbVar23 = pbVar23 + 4;
          }
        }
      } while (bVar3 != 0);
      bVar3 = *pbVar23;
      *pbVar23 = 0;
      while (pbVar23 = pbVar23 + 1, ((anonymous_namespace)::chartype_table[bVar3] & 8) != 0) {
        bVar3 = *pbVar23;
      }
      pbVar27 = pbVar23;
      pbVar29 = pbVar23;
      xVar14 = status_bad_attribute;
      if (bVar3 != 0x3d) goto LAB_00132a2b;
      do {
        pbVar23 = pbVar29;
        bVar3 = *pbVar23;
        pbVar29 = pbVar23 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0);
      if ((bVar3 != 0x22) && (pbVar27 = pbVar23, bVar3 != 0x27)) goto LAB_00132a2b;
      pxVar8->value = (char_t *)pbVar29;
      pbVar23 = (byte *)(*local_40)(pbVar29,(int)(char)bVar3);
      xVar14 = status_bad_attribute;
      if (pbVar23 == (byte *)0x0) {
        pbVar23 = (byte *)0x0;
        pbVar27 = (byte *)pxVar8->value;
        goto LAB_00132a2b;
      }
      bVar2 = true;
      pbVar27 = pbVar23;
      if ((char)(anonymous_namespace)::chartype_table[*pbVar23] < '\0') goto LAB_00132a2b;
    }
    pbVar27 = pbVar23;
    if (!bVar2) goto LAB_00132cf8;
  }
  if (bVar3 == 0x3e) goto LAB_00132000;
  if (bVar3 == 0x2f) {
    if (*pbVar27 == 0x3e) {
      pxVar7 = pxVar7->parent;
      pbVar27 = pbVar23 + 2;
      goto LAB_00132000;
    }
    pbVar23 = pbVar27;
    if ((endch == 0x3e) && (*pbVar27 == 0)) {
      pxVar7 = pxVar7->parent;
      goto LAB_00132000;
    }
  }
  else if ((endch == 0x3e) && (pbVar27 = pbVar23, bVar3 == 0)) goto LAB_00132000;
  goto LAB_00132e58;
code_r0x0013215d:
  bVar1 = *pbVar29;
  pbVar24 = pbVar27 + 1;
  pbVar27 = pbVar27 + 1;
  pbVar29 = pbVar29 + 1;
  if (bVar3 != bVar1) goto LAB_001327de;
  goto LAB_00132150;
LAB_00132cf8:
  pbVar27 = (byte *)(local_e8.error_offset + -(long)local_a8);
  if ((byte *)local_e8.error_offset == (byte *)0x0) {
    pbVar27 = (byte *)0x0;
  }
  xVar4 = (xml_encoding)local_60;
  if (((long)pbVar27 < 0) || (local_38 < pbVar27)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xdd9,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  if (local_e8.error_status == status_ok) {
    if (endch == 0x3c) {
      __return_storage_ptr__->encoding = encoding_auto;
      __return_storage_ptr__->status = status_unrecognized_tag;
LAB_00132d7a:
      __return_storage_ptr__->offset = (ptrdiff_t)local_b0;
      goto LAB_00132d83;
    }
    if ((options >> 0xc & 1) == 0) {
      ppxVar22 = &local_70->next_sibling;
      if (local_70 == (xml_node_struct *)0x0) {
        ppxVar22 = local_50;
      }
      for (pxVar7 = *ppxVar22; pxVar7 != (xml_node_struct *)0x0; pxVar7 = pxVar7->next_sibling) {
        if ((pxVar7->header & 0xf) == 2) goto LAB_00132d53;
      }
      if (pxVar7 == (xml_node_struct *)0x0) {
        __return_storage_ptr__->encoding = encoding_auto;
        __return_storage_ptr__->status = status_no_document_element;
        goto LAB_00132d7a;
      }
    }
  }
  else if (0 < (long)pbVar27) {
    pbVar27 = pbVar27 + -(ulong)(endch == 0 && pbVar27 == local_b0);
  }
LAB_00132d53:
  __return_storage_ptr__->status = local_e8.error_status;
  __return_storage_ptr__->offset = (ptrdiff_t)pbVar27;
  __return_storage_ptr__->encoding = encoding_auto;
LAB_00132d83:
  __return_storage_ptr__->encoding = xVar4;
  pvVar30 = (void *)0x0;
LAB_00132d8a:
  if (pvVar30 != (void *)0x0) {
    (*local_68)(pvVar30);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : 0, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}